

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSComputerRS232Port.h
# Opt level: O0

int OpenComputerRS232Port(HANDLE *phDev,char *szDevice)

{
  int iVar1;
  undefined4 local_28;
  int local_24;
  int dtr_bit;
  int fd;
  char *szDevice_local;
  HANDLE *phDev_local;
  
  _dtr_bit = szDevice;
  szDevice_local = (char *)phDev;
  local_24 = open(szDevice,0x902);
  local_28 = 2;
  if (local_24 == -1) {
    phDev_local._4_4_ = 1;
  }
  else {
    iVar1 = fcntl(local_24,4,0);
    if (iVar1 == -1) {
      close(local_24);
      phDev_local._4_4_ = 1;
    }
    else {
      ioctl(local_24,0x5417,&local_28);
      signal(0xd,(__sighandler_t)0x1);
      *(long *)szDevice_local = (long)local_24;
      phDev_local._4_4_ = 0;
    }
  }
  return phDev_local._4_4_;
}

Assistant:

inline int OpenComputerRS232Port(HANDLE* phDev, char* szDevice)
{
#ifdef _WIN32
	HANDLE hDev = INVALID_HANDLE_VALUE;
	char szDeviceTemp[2*(MAX_COMPUTERRS232PORT_NAME_LENGTH+8)];
	TCHAR tstr[2*(MAX_COMPUTERRS232PORT_NAME_LENGTH+8)];

	if (strlen(szDevice) > MAX_COMPUTERRS232PORT_NAME_LENGTH)
	{
		PRINT_DEBUG_ERROR_OSCOMPUTERRS232PORT(("OpenComputerRS232Port error (%s) : %s"
			"(szDevice=%s)\n", 
			strtime_m(), 
			szOSUtilsErrMsgs[EXIT_NAME_TOO_LONG], 
			szDevice));
		return EXIT_NAME_TOO_LONG;
	}

	// To be able to use COM10 and greater we need to add "\\.\" (that becomes "\\\\.\\" 
	// in C because the '\' is a special character).
	memset(szDeviceTemp, 0, sizeof(szDeviceTemp));
#ifdef WINCE
	strcpy(szDeviceTemp, szDevice);
#else
	sprintf(szDeviceTemp, "\\\\.\\%s", szDevice);
#endif // WINCE

#ifdef UNICODE
	mbstowcs(tstr, szDeviceTemp, sizeof(szDeviceTemp)/2);
#else
	memcpy(tstr, szDeviceTemp, sizeof(szDeviceTemp)/2);
#endif // UNICODE
	tstr[sizeof(tstr)/sizeof(TCHAR)-1] = 0;

	hDev = CreateFile( 
		tstr,
		GENERIC_READ|GENERIC_WRITE,
		0, // Must be opened with exclusive-access.
		NULL, // No security attributes.
		OPEN_EXISTING, // Must use OPEN_EXISTING.
		0, // Not overlapped I/O. Should use FILE_FLAG_WRITE_THROUGH and maybe also FILE_FLAG_NO_BUFFERING?
		NULL // hTemplate must be NULL for comm devices.
		);

	if (hDev == INVALID_HANDLE_VALUE)
	{
		PRINT_DEBUG_ERROR_OSCOMPUTERRS232PORT(("OpenComputerRS232Port error (%s) : %s"
			"(szDevice=%s)\n", 
			strtime_m(), 
			GetLastErrorMsg(), 
			szDevice));
		return EXIT_FAILURE;
	}

#ifndef DISABLE_FORCE_CLEAR_DTR
	if (!EscapeCommFunction(hDev, CLRDTR))
	{
		PRINT_DEBUG_WARNING_OSCOMPUTERRS232PORT(("OpenComputerRS232Port warning (%s) : %s"
			"(szDevice=%s)\n", 
			strtime_m(), 
			GetLastErrorMsg(), 
			szDevice));
	}
#endif // !DISABLE_FORCE_CLEAR_DTR

	*phDev = hDev;
#else 
	// The O_NOCTTY flag tells UNIX that this program does not want to be the
	// "controlling terminal" for that port. If you don't specify this then any input (such
	// as keyboard abort signals and so forth) will affect your process. Programs like
	// getty(1M/8) use this feature when starting the login process, but normally a
	// user program does not want this behavior.
	// The O_NDELAY flag tells UNIX that this program does not care what state the
	// DCD signal line is in - whether the other end of the port is up and running. If
	// you do not specify this flag, your process will be put to sleep until the DCD
	// signal line is the space voltage.
	// Should use O_SYNC and maybe also O_DIRECT?
	int fd = open(szDevice, O_RDWR|O_NOCTTY|O_NDELAY);
#ifndef DISABLE_FORCE_CLEAR_DTR
	int dtr_bit = TIOCM_DTR;
#endif // !DISABLE_FORCE_CLEAR_DTR

	if (fd == -1)
	{
		PRINT_DEBUG_ERROR_OSCOMPUTERRS232PORT(("OpenComputerRS232Port error (%s) : %s"
			"(szDevice=%s)\n", 
			strtime_m(), 
			GetLastErrorMsg(), 
			szDevice));
		return EXIT_FAILURE;
	}

	// The read function can be made to return immediately by
	// doing the following :
	// fcntl(fd, F_SETFL, FNDELAY);
	// The FNDELAY option causes the read function to return 0 if no characters are
	// available on the port. To restore normal (blocking) behavior, call fcntl() without
	// the FNDELAY option:
	if (fcntl(fd, F_SETFL, 0) == (-1))
	{
		PRINT_DEBUG_ERROR_OSCOMPUTERRS232PORT(("OpenComputerRS232Port error (%s) : (F_SETFL) %s"
			"(szDevice=%s)\n", 
			strtime_m(), 
			GetLastErrorMsg(), 
			szDevice));
		close(fd);
		return EXIT_FAILURE;
	}

#ifndef DISABLE_FORCE_CLEAR_DTR
	if (ioctl(fd, TIOCMBIC, &dtr_bit) != EXIT_SUCCESS)
	{
		PRINT_DEBUG_WARNING_OSCOMPUTERRS232PORT(("OpenComputerRS232Port warning (%s) : (TIOCMBIC) %s"
			"(szDevice=%s)\n", 
			strtime_m(), 
			GetLastErrorMsg(), 
			szDevice));
	}
#endif // !DISABLE_FORCE_CLEAR_DTR

#ifndef DISABLE_IGNORE_SIGPIPE
	// See https://stackoverflow.com/questions/17332646/server-dies-on-send-if-client-was-closed-with-ctrlc...
	if (signal(SIGPIPE, SIG_IGN) == SIG_ERR)
	{
		PRINT_DEBUG_WARNING_OSCOMPUTERRS232PORT(("OpenComputerRS232Port warning (%s) : (SIGPIPE, SIG_IGN) %s"
			"(szDevice=%s)\n",
			strtime_m(),
			"signal failed ",
			szDevice));
	}
#endif // DISABLE_IGNORE_SIGPIPE

	*phDev = (HANDLE)(intptr_t)fd;
#endif // _WIN32

	return EXIT_SUCCESS;
}